

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O2

FT_Error sfnt_load_face(FT_Stream stream,TT_Face face,FT_Int face_instance_index,FT_Int num_params,
                       FT_Parameter *params)

{
  FT_String **name;
  FT_String **name_00;
  FT_Long *pFVar1;
  byte bVar2;
  ushort uVar3;
  FT_UShort FVar4;
  short sVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  short sVar8;
  FT_Encoding FVar9;
  long lVar10;
  FT_Incremental_InterfaceRec *pFVar11;
  FT_CharMap pFVar12;
  FT_Memory memory;
  bool bVar13;
  undefined1 auVar14 [12];
  uint uVar19;
  FT_Error FVar15;
  FT_Error FVar16;
  int iVar17;
  int iVar18;
  ulong uVar20;
  TT_Table pTVar21;
  undefined8 uVar22;
  FT_String *pFVar23;
  ulong uVar24;
  FT_Bitmap_Size *pFVar25;
  FT_UInt *pFVar26;
  FT_UShort *pFVar27;
  ulong uVar28;
  uint uVar29;
  void *pvVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  uint local_98;
  int local_94;
  uint local_90;
  uint local_8c;
  void *local_88;
  void *local_80;
  FT_Memory local_78;
  undefined8 local_70;
  FT_CharMapRec cmaprec;
  uint local_40;
  undefined1 auVar34 [16];
  
  local_88 = face->sfnt;
  uVar20 = 0;
  uVar24 = (ulong)(uint)num_params;
  if (num_params < 1) {
    uVar24 = uVar20;
  }
  bVar32 = false;
  local_70 = 0;
  bVar13 = false;
  for (; uVar24 * 0x10 != uVar20; uVar20 = uVar20 + 0x10) {
    lVar10 = *(long *)((long)&params->tag + uVar20);
    if (lVar10 == 0x69677066) {
      bVar13 = true;
    }
    else if (lVar10 == 0x69736278) {
      bVar32 = true;
    }
    else if (lVar10 == 0x69677073) {
      local_70 = 1;
    }
  }
  local_94 = (int)CONCAT71((int7)(uVar24 * 0x10 >> 8),1);
  bVar31 = true;
  if (((face->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) {
    pTVar21 = tt_face_lookup_table(face,0x676c7966);
    bVar31 = true;
    if (pTVar21 == (TT_Table)0x0) {
      pTVar21 = tt_face_lookup_table(face,0x43464620);
      bVar31 = true;
      if (pTVar21 == (TT_Table)0x0) {
        pTVar21 = tt_face_lookup_table(face,0x43464632);
        bVar31 = pTVar21 != (TT_Table)0x0;
      }
    }
  }
  local_8c = (*face->goto_table)(face,0x43424c43,stream,(FT_ULong *)0x0);
  FVar15 = (*face->goto_table)(face,0x43424454,stream,(FT_ULong *)0x0);
  FVar16 = (*face->goto_table)(face,0x45424c43,stream,(FT_ULong *)0x0);
  local_80 = (void *)CONCAT44(local_80._4_4_,FVar16);
  FVar16 = (*face->goto_table)(face,0x626c6f63,stream,(FT_ULong *)0x0);
  local_78 = (FT_Memory)CONCAT44(local_78._4_4_,FVar16);
  FVar16 = (*face->goto_table)(face,0x73626978,stream,(FT_ULong *)0x0);
  pvVar30 = local_88;
  local_90 = CONCAT31(local_90._1_3_,!bVar32 && FVar16 == 0);
  if ((bVar31) || (*(code **)((long)local_88 + 0x88) == (code *)0x0)) {
LAB_00205320:
    iVar17 = (**(code **)((long)pvVar30 + 0x30))(face,stream);
    if (iVar17 != 0) {
      return iVar17;
    }
    local_98 = 0;
  }
  else {
    uVar22 = (**(code **)((long)local_88 + 0x88))(face,stream);
    bVar32 = (int)uVar22 != 0;
    local_94 = (int)CONCAT71((int7)((ulong)uVar22 >> 8),bVar32);
    if (bVar32 || (local_90 & 1) != 0) goto LAB_00205320;
    local_94 = 0;
  }
  pvVar30 = local_88;
  if (FVar15 == 0) {
    bVar31 = false;
  }
  if (local_8c == 0) {
    bVar31 = false;
  }
  if ((ushort)((face->header).Units_Per_EM + 0xbfff) < 0xc00f) {
    return 8;
  }
  (**(code **)((long)local_88 + 0x48))(face,stream);
  (**(code **)((long)pvVar30 + 0x40))(face,stream);
  (**(code **)((long)pvVar30 + 0x60))(face,stream);
  iVar17 = (**(code **)((long)pvVar30 + 0x58))(face,stream);
  if ((char)local_94 != '\0') {
    local_98 = (**(code **)((long)pvVar30 + 0x38))(face,stream,0);
    if (local_98 == 0) {
      iVar18 = (**(code **)((long)pvVar30 + 0xb8))(face,stream,0);
      if ((char)iVar18 == -0x72) {
        local_98 = 0x93;
        goto LAB_00205432;
      }
      if (iVar18 != 0) {
        return iVar18;
      }
      local_98 = 0;
    }
    else {
      if ((char)local_98 != -0x72) {
        return local_98;
      }
      if (face->format_tag == 0x74727565) {
        bVar31 = false;
      }
      else {
        local_98 = 0x8f;
LAB_00205432:
        pFVar11 = ((face->root).internal)->incremental_interface;
        if (pFVar11 == (FT_Incremental_InterfaceRec *)0x0) {
          return local_98;
        }
        if (pFVar11->funcs->get_glyph_metrics == (FT_Incremental_GetGlyphMetricsFunc)0x0) {
          return local_98;
        }
        (face->horizontal).number_Of_HMetrics = 0;
      }
    }
    pvVar30 = local_88;
    local_98 = (**(code **)((long)local_88 + 0x38))(face,stream,1);
    uVar19 = local_98;
    if ((local_98 == 0) &&
       (local_98 = (**(code **)((long)pvVar30 + 0xb8))(face,stream,1), uVar19 = local_98,
       local_98 == 0)) {
      face->vertical_info = '\x01';
      uVar19 = 0;
    }
    pvVar30 = local_88;
    if (uVar19 != 0 && (char)uVar19 != -0x72) {
      return local_98;
    }
    local_98 = (**(code **)((long)local_88 + 0x50))(face,stream);
    if (local_98 != 0) {
      (face->os2).version = 0xffff;
    }
  }
  if (*(code **)((long)pvVar30 + 0xc0) != (code *)0x0) {
    if (((local_8c == 0 || (int)local_80 == 0) || (int)local_78 == 0) || (local_90 & 1) != 0) {
      (**(code **)((long)pvVar30 + 0xc0))(face,stream);
    }
  }
  if (*(code **)((long)pvVar30 + 0xe0) != (code *)0x0) {
    (**(code **)((long)pvVar30 + 0xe0))(face,stream);
    (**(code **)((long)pvVar30 + 0xe8))(face,stream);
  }
  if (*(code **)((long)pvVar30 + 0x158) != (code *)0x0) {
    (**(code **)((long)pvVar30 + 0x158))(face,stream);
  }
  (**(code **)((long)pvVar30 + 0x80))(face,stream);
  (**(code **)((long)pvVar30 + 0x78))(face,stream);
  (**(code **)((long)pvVar30 + 0x70))(face,stream);
  (face->root).num_glyphs = (ulong)(face->max_profile).numGlyphs;
  name = &(face->root).family_name;
  name_00 = &(face->root).style_name;
  (face->root).family_name = (FT_String *)0x0;
  (face->root).style_name = (FT_String *)0x0;
  if (((face->os2).version == 0xffff) || (((face->os2).fsSelection & 0x100) == 0)) {
    local_98 = tt_face_get_name(face,0x15,name);
    if (local_98 != 0) {
      return local_98;
    }
    pFVar23 = *name;
    if (!bVar13 && pFVar23 == (FT_String *)0x0) {
      FVar15 = tt_face_get_name(face,0x10,name);
      if (FVar15 != 0) {
        return FVar15;
      }
      pFVar23 = *name;
    }
    local_98 = 0;
    if ((pFVar23 == (FT_String *)0x0) && (FVar15 = tt_face_get_name(face,1,name), FVar15 != 0)) {
      return FVar15;
    }
    local_98 = 0;
    local_98 = tt_face_get_name(face,0x16,name_00);
    if (local_98 != 0) {
      return local_98;
    }
    pFVar23 = *name_00;
    uVar19 = 0;
    if ((char)local_70 == '\0' && pFVar23 == (FT_String *)0x0) {
      FVar15 = tt_face_get_name(face,0x11,name_00);
      if (FVar15 != 0) {
        return FVar15;
      }
      pFVar23 = *name_00;
      uVar19 = 0;
    }
  }
  else {
    if (bVar13) {
LAB_00205633:
      uVar19 = tt_face_get_name(face,1,name);
      if (uVar19 != 0) {
        return uVar19;
      }
    }
    else {
      FVar15 = tt_face_get_name(face,0x10,name);
      if (FVar15 != 0) {
        return FVar15;
      }
      local_98 = 0;
      uVar19 = 0;
      if (*name == (FT_String *)0x0) goto LAB_00205633;
    }
    local_98 = uVar19;
    if (((char)local_70 == '\0') && (local_98 = tt_face_get_name(face,0x11,name_00), local_98 != 0))
    {
      return local_98;
    }
    pFVar23 = *name_00;
    uVar19 = local_98;
  }
  local_98 = uVar19;
  if ((pFVar23 == (FT_String *)0x0) && (local_98 = tt_face_get_name(face,2,name_00), local_98 != 0))
  {
    return local_98;
  }
  uVar24 = (face->root).face_flags;
  if ((((face->sbit_table_type & ~TT_SBIT_TABLE_TYPE_EBLC) == TT_SBIT_TABLE_TYPE_CBLC) ||
      (face->colr != (void *)0x0)) || (face->svg != (void *)0x0)) {
    uVar24 = uVar24 | 0x4000;
  }
  if (bVar31) {
    if ((char)local_90 == '\0') {
      uVar24 = uVar24 | 1;
    }
    else {
      uVar24 = uVar24 | 0x20000;
    }
  }
  uVar20 = uVar24 | 0x18;
  if ((iVar17 == 0) && ((face->postscript).FormatType != 0x30000)) {
    uVar20 = uVar24 | 0x218;
  }
  uVar24 = uVar20 | 4;
  if ((face->postscript).isFixedPitch == 0) {
    uVar24 = uVar20;
  }
  uVar20 = uVar24 | 0x20;
  if (face->vertical_info == '\0') {
    uVar20 = uVar24;
  }
  uVar24 = uVar20 | 0x40;
  if (face->kern_avail_bits == 0) {
    uVar24 = uVar20;
  }
  (face->root).face_flags = (face->variation_support & 1) << 8 | uVar24;
  if ((bVar31) && ((face->os2).version != 0xffff)) {
    uVar3 = (face->os2).fsSelection;
    uVar24 = (ulong)((uint)((uVar3 & 0x201) != 0) | uVar3 >> 4 & 2);
  }
  else {
    bVar2 = (byte)(face->header).Mac_Style;
    uVar24 = (ulong)(byte)((bVar2 & 2) >> 1 | bVar2 * '\x02') & 3;
  }
  pFVar1 = &(face->root).style_flags;
  *pFVar1 = *pFVar1 | uVar24;
  tt_face_build_cmaps(face);
  uVar19 = (face->root).num_charmaps;
  uVar20 = 0;
  uVar24 = (ulong)uVar19;
  if ((int)uVar19 < 1) {
    uVar24 = uVar20;
  }
  bVar32 = false;
  for (; uVar20 != uVar24; uVar20 = uVar20 + 1) {
    pFVar12 = (face->root).charmaps[uVar20];
    for (uVar28 = 0; uVar28 < 0x84; uVar28 = uVar28 + 0xc) {
      if ((*(uint *)((long)&sfnt_find_encoding_tt_encodings + uVar28) == (uint)pFVar12->platform_id)
         && ((*(uint *)((long)&DAT_002be0f4 + uVar28) == (uint)pFVar12->encoding_id ||
             (*(uint *)((long)&DAT_002be0f4 + uVar28) == 0xffffffff)))) {
        FVar9 = *(FT_Encoding *)((long)&DAT_002be0f8 + uVar28);
        pFVar12->encoding = FVar9;
        if ((FVar9 == FT_ENCODING_UNICODE) || (FVar9 == FT_ENCODING_MS_SYMBOL)) {
          bVar32 = true;
        }
        goto LAB_00205844;
      }
    }
    pFVar12->encoding = FT_ENCODING_NONE;
LAB_00205844:
  }
  if ((!bVar32) && (((face->root).face_flags & 0x200) != 0)) {
    cmaprec.encoding = FT_ENCODING_UNICODE;
    cmaprec.platform_id = 3;
    cmaprec.encoding_id = 1;
    cmaprec.face = &face->root;
    uVar19 = FT_CMap_New(&tt_cmap_unicode_class_rec.clazz,(FT_Pointer)0x0,&cmaprec,
                         (FT_CMap_conflict *)0x0);
    if ((uVar19 != 0) && (((char)uVar19 != -0x5d && ((uVar19 & 0xff) != 7)))) {
      return uVar19;
    }
    local_98 = 0;
  }
  uVar24 = (ulong)face->sbit_num_strikes;
  if (uVar24 != 0) {
    memory = ((face->root).stream)->memory;
    uVar3 = (face->header).Units_Per_EM;
    uVar19 = (uint)uVar3;
    if ((uVar3 == 0) || ((face->os2).version == 0xffff)) {
      uVar19 = 1;
      local_94 = CONCAT22(local_94._2_2_,1);
    }
    else {
      local_94 = CONCAT22(local_94._2_2_,(face->os2).xAvgCharWidth);
    }
    pFVar25 = (FT_Bitmap_Size *)
              ft_mem_realloc(memory,0x20,0,uVar24,(void *)0x0,(FT_Error *)&local_98);
    (face->root).available_sizes = pFVar25;
    if (local_98 != 0) {
      return local_98;
    }
    uVar29 = 0;
    local_80 = ft_mem_qrealloc(memory,4,0,uVar24,(void *)0x0,(FT_Error *)&local_98);
    if (local_98 != 0) {
      return local_98;
    }
    local_94 = (int)(short)local_94;
    local_90 = uVar19 >> 1;
    local_8c = uVar19;
    local_78 = memory;
    for (uVar20 = 0; uVar28 = (ulong)uVar29, uVar24 != uVar20; uVar20 = uVar20 + 1) {
      pFVar25 = (face->root).available_sizes;
      local_98 = (**(code **)((long)local_88 + 0xd8))(face,uVar20,&cmaprec);
      if (local_98 == 0) {
        pFVar25[uVar28].height = (FT_Short)(local_40 >> 6);
        pFVar25[uVar28].width =
             (FT_Short)((int)((uint)(ushort)cmaprec.face * local_94 + local_90) / (int)local_8c);
        pFVar25[uVar28].x_ppem = ((ulong)cmaprec.face & 0xffff) << 6;
        pFVar25[uVar28].y_ppem = (ulong)cmaprec.face._2_2_ << 6;
        pFVar25[uVar28].size = (ulong)cmaprec.face._2_2_ << 6;
        if (cmaprec.face._2_2_ != 0 && (ushort)cmaprec.face != 0) {
          uVar29 = uVar29 + 1;
          *(int *)((long)local_80 + uVar28 * 4) = (int)uVar20;
        }
      }
    }
    pFVar26 = (FT_UInt *)ft_mem_qrealloc(local_78,4,uVar24,uVar28,local_80,(FT_Error *)&local_98);
    if (uVar29 != 0) {
      face->sbit_strike_map = pFVar26;
      pFVar1 = &(face->root).face_flags;
      *(byte *)pFVar1 = (byte)*pFVar1 | 2;
      (face->root).num_fixed_sizes = uVar29;
    }
  }
  uVar24 = (face->root).face_flags;
  if ((uVar24 & 3) == 0) {
    uVar24 = uVar24 | 1;
    (face->root).face_flags = uVar24;
  }
  if ((uVar24 & 0x20001) == 0) {
    return local_98;
  }
  uVar24._0_2_ = (face->header).xMin;
  uVar24._2_2_ = (face->header).yMin;
  uVar24._4_2_ = (face->header).xMax;
  uVar24._6_2_ = (face->header).yMax;
  auVar34._8_4_ = 0;
  auVar34._0_8_ = uVar24;
  auVar34._12_2_ = uVar24._6_2_;
  auVar34._14_2_ = uVar24._6_2_;
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._8_2_ = 0;
  auVar33._0_8_ = uVar24;
  auVar33._10_2_ = uVar24._4_2_;
  auVar35._10_6_ = auVar33._10_6_;
  auVar35._8_2_ = uVar24._4_2_;
  auVar35._0_8_ = uVar24;
  auVar14._4_8_ = auVar35._8_8_;
  auVar14._2_2_ = uVar24._2_2_;
  auVar14._0_2_ = uVar24._2_2_;
  (face->root).bbox.xMin =
       CONCAT44(-(uint)((short)(undefined2)uVar24 < 0),(int)(short)(undefined2)uVar24);
  *(int *)&(face->root).bbox.xMax = auVar14._0_4_ >> 0x10;
  *(uint *)((long)&(face->root).bbox.xMax + 4) = -(uint)(auVar14._0_4_ < 0);
  uVar19._0_2_ = (face->header).xMax;
  uVar19._2_2_ = (face->header).yMax;
  auVar35 = pshuflw(ZEXT416(uVar19),ZEXT416(uVar19),0x60);
  iVar17 = auVar35._4_4_ >> 0x10;
  (face->root).bbox.xMax = CONCAT44(-(uint)(auVar35._0_4_ < 0),auVar35._0_4_ >> 0x10);
  (face->root).units_per_EM = (short)iVar17;
  (face->root).ascender = (short)((uint)iVar17 >> 0x10);
  *(uint *)&(face->root).descender = -(uint)(auVar35._4_4_ < 0);
  FVar4 = (face->os2).version;
  (face->root).units_per_EM = (face->header).Units_Per_EM;
  if ((FVar4 == 0xffff) || (((face->os2).fsSelection & 0x80) == 0)) {
    uVar6 = (face->horizontal).Ascender;
    sVar8 = (face->horizontal).Descender;
    sVar5 = (face->horizontal).Line_Gap;
    (face->root).ascender = uVar6;
    (face->root).descender = sVar8;
    (face->root).height = (uVar6 - sVar8) + sVar5;
    if ((FVar4 == 0xffff) || ((uVar6 != 0 || (sVar8 != 0)))) goto LAB_00205b51;
    sVar5 = (face->os2).sTypoAscender;
    sVar8 = (face->os2).sTypoDescender;
    if (sVar5 == 0 && sVar8 == 0) {
      uVar7 = (face->os2).usWinAscent;
      (face->root).ascender = uVar7;
      FVar4 = (face->os2).usWinDescent;
      (face->root).descender = -FVar4;
      (face->root).height = FVar4 + uVar7;
      goto LAB_00205b51;
    }
    (face->root).ascender = sVar5;
  }
  else {
    sVar5 = (face->os2).sTypoAscender;
    (face->root).ascender = sVar5;
    sVar8 = (face->os2).sTypoDescender;
  }
  (face->root).descender = sVar8;
  (face->root).height = (sVar5 - sVar8) + (face->os2).sTypoLineGap;
LAB_00205b51:
  sVar8 = (face->postscript).underlineThickness;
  (face->root).max_advance_width = (face->horizontal).advance_Width_Max;
  pFVar27 = &(face->vertical).advance_Height_Max;
  if (face->vertical_info == '\0') {
    pFVar27 = (FT_UShort *)&(face->root).height;
  }
  (face->root).max_advance_height = *pFVar27;
  (face->root).underline_position = sVar8 / -2 + (face->postscript).underlinePosition;
  (face->root).underline_thickness = sVar8;
  return local_98;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  sfnt_load_face( FT_Stream      stream,
                  TT_Face        face,
                  FT_Int         face_instance_index,
                  FT_Int         num_params,
                  FT_Parameter*  params )
  {
    FT_Error  error;
#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
    FT_Error  psnames_error;
#endif

    FT_Bool  has_outline;
    FT_Bool  is_apple_sbit;

    FT_Bool  has_CBLC;
    FT_Bool  has_CBDT;
    FT_Bool  has_EBLC;
    FT_Bool  has_bloc;
    FT_Bool  has_sbix;

    FT_Bool  ignore_typographic_family    = FALSE;
    FT_Bool  ignore_typographic_subfamily = FALSE;
    FT_Bool  ignore_sbix                  = FALSE;

    SFNT_Service  sfnt = (SFNT_Service)face->sfnt;

    FT_UNUSED( face_instance_index );


    /* Check parameters */

    {
      FT_Int  i;


      for ( i = 0; i < num_params; i++ )
      {
        if ( params[i].tag == FT_PARAM_TAG_IGNORE_TYPOGRAPHIC_FAMILY )
          ignore_typographic_family = TRUE;
        else if ( params[i].tag == FT_PARAM_TAG_IGNORE_TYPOGRAPHIC_SUBFAMILY )
          ignore_typographic_subfamily = TRUE;
        else if ( params[i].tag == FT_PARAM_TAG_IGNORE_SBIX )
          ignore_sbix = TRUE;
      }
    }

    /* Load tables */

    /* We now support two SFNT-based bitmapped font formats.  They */
    /* are recognized easily as they do not include a `glyf'       */
    /* table.                                                      */
    /*                                                             */
    /* The first format comes from Apple, and uses a table named   */
    /* `bhed' instead of `head' to store the font header (using    */
    /* the same format).  It also doesn't include horizontal and   */
    /* vertical metrics tables (i.e. `hhea' and `vhea' tables are  */
    /* missing).                                                   */
    /*                                                             */
    /* The other format comes from Microsoft, and is used with     */
    /* WinCE/PocketPC.  It looks like a standard TTF, except that  */
    /* it doesn't contain outlines.                                */
    /*                                                             */

    FT_TRACE2(( "sfnt_load_face: %p\n", (void *)face ));
    FT_TRACE2(( "\n" ));

    /* do we have outlines in there? */
#ifdef FT_CONFIG_OPTION_INCREMENTAL
    has_outline = FT_BOOL( face->root.internal->incremental_interface ||
                           tt_face_lookup_table( face, TTAG_glyf )    ||
                           tt_face_lookup_table( face, TTAG_CFF )     ||
                           tt_face_lookup_table( face, TTAG_CFF2 )    );
#else
    has_outline = FT_BOOL( tt_face_lookup_table( face, TTAG_glyf ) ||
                           tt_face_lookup_table( face, TTAG_CFF )  ||
                           tt_face_lookup_table( face, TTAG_CFF2 ) );
#endif

    /* check which sbit formats are present */
    has_CBLC = !face->goto_table( face, TTAG_CBLC, stream, 0 );
    has_CBDT = !face->goto_table( face, TTAG_CBDT, stream, 0 );
    has_EBLC = !face->goto_table( face, TTAG_EBLC, stream, 0 );
    has_bloc = !face->goto_table( face, TTAG_bloc, stream, 0 );
    has_sbix = !face->goto_table( face, TTAG_sbix, stream, 0 );

    is_apple_sbit = FALSE;

    if ( ignore_sbix )
      has_sbix = FALSE;

    /* if this font doesn't contain outlines, we try to load */
    /* a `bhed' table                                        */
    if ( !has_outline && sfnt->load_bhed )
    {
      LOAD_( bhed );
      is_apple_sbit = FT_BOOL( !error );
    }

    /* load the font header (`head' table) if this isn't an Apple */
    /* sbit font file                                             */
    if ( !is_apple_sbit || has_sbix )
    {
      LOAD_( head );
      if ( error )
        goto Exit;
    }

    /* Ignore outlines for CBLC/CBDT fonts. */
    if ( has_CBLC || has_CBDT )
      has_outline = FALSE;

    /* OpenType 1.8.2 introduced limits to this value;    */
    /* however, they make sense for older SFNT fonts also */
    if ( face->header.Units_Per_EM <    16 ||
         face->header.Units_Per_EM > 16384 )
    {
      error = FT_THROW( Invalid_Table );

      goto Exit;
    }

    /* the following tables are often not present in embedded TrueType */
    /* fonts within PDF documents, so don't check for them.            */
    LOAD_( maxp );
    LOAD_( cmap );

    /* the following tables are optional in PCL fonts -- */
    /* don't check for errors                            */
    LOAD_( name );
    LOAD_( post );

#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
    psnames_error = error;
#endif

    /* do not load the metrics headers and tables if this is an Apple */
    /* sbit font file                                                 */
    if ( !is_apple_sbit )
    {
      /* load the `hhea' and `hmtx' tables */
      LOADM_( hhea, 0 );
      if ( !error )
      {
        LOADM_( hmtx, 0 );
        if ( FT_ERR_EQ( error, Table_Missing ) )
        {
          error = FT_THROW( Hmtx_Table_Missing );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
          /* If this is an incrementally loaded font and there are */
          /* overriding metrics, tolerate a missing `hmtx' table.  */
          if ( face->root.internal->incremental_interface          &&
               face->root.internal->incremental_interface->funcs->
                 get_glyph_metrics                                 )
          {
            face->horizontal.number_Of_HMetrics = 0;
            error                               = FT_Err_Ok;
          }
#endif
        }
      }
      else if ( FT_ERR_EQ( error, Table_Missing ) )
      {
        /* No `hhea' table necessary for SFNT Mac fonts. */
        if ( face->format_tag == TTAG_true )
        {
          FT_TRACE2(( "This is an SFNT Mac font.\n" ));

          has_outline = 0;
          error       = FT_Err_Ok;
        }
        else
        {
          error = FT_THROW( Horiz_Header_Missing );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
          /* If this is an incrementally loaded font and there are */
          /* overriding metrics, tolerate a missing `hhea' table.  */
          if ( face->root.internal->incremental_interface          &&
               face->root.internal->incremental_interface->funcs->
                 get_glyph_metrics                                 )
          {
            face->horizontal.number_Of_HMetrics = 0;
            error                               = FT_Err_Ok;
          }
#endif

        }
      }

      if ( error )
        goto Exit;

      /* try to load the `vhea' and `vmtx' tables */
      LOADM_( hhea, 1 );
      if ( !error )
      {
        LOADM_( hmtx, 1 );
        if ( !error )
          face->vertical_info = 1;
      }

      if ( error && FT_ERR_NEQ( error, Table_Missing ) )
        goto Exit;

      LOAD_( os2 );
      if ( error )
      {
        /* we treat the table as missing if there are any errors */
        face->os2.version = 0xFFFFU;
      }
    }

    /* the optional tables */

    /* embedded bitmap support */
    /* TODO: Replace this clumsy check for all possible sbit tables     */
    /*       with something better (for example, by passing a parameter */
    /*       to suppress 'sbix' loading).                               */
    if ( sfnt->load_eblc                                  &&
         ( has_CBLC || has_EBLC || has_bloc || has_sbix ) )
      LOAD_( eblc );

    /* colored glyph support */
    if ( sfnt->load_cpal )
    {
      LOAD_( cpal );
      LOAD_( colr );
    }

    /* OpenType-SVG glyph support */
    if ( sfnt->load_svg )
      LOAD_( svg );

    /* consider the pclt, kerning, and gasp tables as optional */
    LOAD_( pclt );
    LOAD_( gasp );
    LOAD_( kern );

    face->root.num_glyphs = face->max_profile.numGlyphs;

    /* Bit 8 of the `fsSelection' field in the `OS/2' table denotes  */
    /* a WWS-only font face.  `WWS' stands for `weight', width', and */
    /* `slope', a term used by Microsoft's Windows Presentation      */
    /* Foundation (WPF).  This flag has been introduced in version   */
    /* 1.5 of the OpenType specification (May 2008).                 */

    face->root.family_name = NULL;
    face->root.style_name  = NULL;
    if ( face->os2.version != 0xFFFFU && face->os2.fsSelection & 256 )
    {
      if ( !ignore_typographic_family )
        GET_NAME( TYPOGRAPHIC_FAMILY, &face->root.family_name );
      if ( !face->root.family_name )
        GET_NAME( FONT_FAMILY, &face->root.family_name );

      if ( !ignore_typographic_subfamily )
        GET_NAME( TYPOGRAPHIC_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name )
        GET_NAME( FONT_SUBFAMILY, &face->root.style_name );
    }
    else
    {
      GET_NAME( WWS_FAMILY, &face->root.family_name );
      if ( !face->root.family_name && !ignore_typographic_family )
        GET_NAME( TYPOGRAPHIC_FAMILY, &face->root.family_name );
      if ( !face->root.family_name )
        GET_NAME( FONT_FAMILY, &face->root.family_name );

      GET_NAME( WWS_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name && !ignore_typographic_subfamily )
        GET_NAME( TYPOGRAPHIC_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name )
        GET_NAME( FONT_SUBFAMILY, &face->root.style_name );
    }

    /* now set up root fields */
    {
      FT_Face  root  = &face->root;
      FT_Long  flags = root->face_flags;


      /**********************************************************************
       *
       * Compute face flags.
       */
      if ( face->sbit_table_type == TT_SBIT_TABLE_TYPE_CBLC ||
           face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX ||
           face->colr                                       ||
           face->svg                                        )
        flags |= FT_FACE_FLAG_COLOR;      /* color glyphs */

      if ( has_outline == TRUE )
      {
        /* by default (and for backward compatibility) we handle */
        /* fonts with an 'sbix' table as bitmap-only             */
        if ( has_sbix )
          flags |= FT_FACE_FLAG_SBIX;     /* with 'sbix' bitmaps */
        else
          flags |= FT_FACE_FLAG_SCALABLE; /* scalable outlines */
      }

      /* The sfnt driver only supports bitmap fonts natively, thus we */
      /* don't set FT_FACE_FLAG_HINTER.                               */
      flags |= FT_FACE_FLAG_SFNT       |  /* SFNT file format  */
               FT_FACE_FLAG_HORIZONTAL;   /* horizontal data   */

#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
      if ( !psnames_error                             &&
           face->postscript.FormatType != 0x00030000L )
        flags |= FT_FACE_FLAG_GLYPH_NAMES;
#endif

      /* fixed width font? */
      if ( face->postscript.isFixedPitch )
        flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* vertical information? */
      if ( face->vertical_info )
        flags |= FT_FACE_FLAG_VERTICAL;

      /* kerning available ? */
      if ( TT_FACE_HAS_KERNING( face ) )
        flags |= FT_FACE_FLAG_KERNING;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      /* Don't bother to load the tables unless somebody asks for them. */
      /* No need to do work which will (probably) not be used.          */
      if ( face->variation_support & TT_FACE_FLAG_VAR_FVAR )
        flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;
#endif

      root->face_flags = flags;

      /**********************************************************************
       *
       * Compute style flags.
       */

      flags = 0;
      if ( has_outline == TRUE && face->os2.version != 0xFFFFU )
      {
        /* We have an OS/2 table; use the `fsSelection' field.  Bit 9 */
        /* indicates an oblique font face.  This flag has been        */
        /* introduced in version 1.5 of the OpenType specification.   */

        if ( face->os2.fsSelection & 512 )       /* bit 9 */
          flags |= FT_STYLE_FLAG_ITALIC;
        else if ( face->os2.fsSelection & 1 )    /* bit 0 */
          flags |= FT_STYLE_FLAG_ITALIC;

        if ( face->os2.fsSelection & 32 )        /* bit 5 */
          flags |= FT_STYLE_FLAG_BOLD;
      }
      else
      {
        /* this is an old Mac font, use the header field */

        if ( face->header.Mac_Style & 1 )
          flags |= FT_STYLE_FLAG_BOLD;

        if ( face->header.Mac_Style & 2 )
          flags |= FT_STYLE_FLAG_ITALIC;
      }

      root->style_flags |= flags;

      /**********************************************************************
       *
       * Polish the charmaps.
       *
       *   Try to set the charmap encoding according to the platform &
       *   encoding ID of each charmap.  Emulate Unicode charmap if one
       *   is missing.
       */

      tt_face_build_cmaps( face );  /* ignore errors */


      /* set the encoding fields */
      {
        FT_Int   m;
#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES
        FT_Bool  has_unicode = FALSE;
#endif


        for ( m = 0; m < root->num_charmaps; m++ )
        {
          FT_CharMap  charmap = root->charmaps[m];


          charmap->encoding = sfnt_find_encoding( charmap->platform_id,
                                                  charmap->encoding_id );

#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES

          if ( charmap->encoding == FT_ENCODING_UNICODE   ||
               charmap->encoding == FT_ENCODING_MS_SYMBOL )  /* PUA */
            has_unicode = TRUE;
        }

        /* synthesize Unicode charmap if one is missing */
        if ( !has_unicode                                &&
             root->face_flags & FT_FACE_FLAG_GLYPH_NAMES )
        {
          FT_CharMapRec  cmaprec;


          cmaprec.face        = root;
          cmaprec.platform_id = TT_PLATFORM_MICROSOFT;
          cmaprec.encoding_id = TT_MS_ID_UNICODE_CS;
          cmaprec.encoding    = FT_ENCODING_UNICODE;


          error = FT_CMap_New( (FT_CMap_Class)&tt_cmap_unicode_class_rec,
                               NULL, &cmaprec, NULL );
          if ( error                                      &&
               FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) &&
               FT_ERR_NEQ( error, Unimplemented_Feature ) )
            goto Exit;
          error = FT_Err_Ok;

#endif /* FT_CONFIG_OPTION_POSTSCRIPT_NAMES */

        }
      }

#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

      /*
       * Now allocate the root array of FT_Bitmap_Size records and
       * populate them.  Unfortunately, it isn't possible to indicate bit
       * depths in the FT_Bitmap_Size record.  This is a design error.
       */
      {
        FT_UInt  count;


        count = face->sbit_num_strikes;

        if ( count > 0 )
        {
          FT_Memory        memory   = face->root.stream->memory;
          FT_UShort        em_size  = face->header.Units_Per_EM;
          FT_Short         avgwidth = face->os2.xAvgCharWidth;
          FT_Size_Metrics  metrics;

          FT_UInt*  sbit_strike_map = NULL;
          FT_UInt   strike_idx, bsize_idx;


          if ( em_size == 0 || face->os2.version == 0xFFFFU )
          {
            avgwidth = 1;
            em_size = 1;
          }

          /* to avoid invalid strike data in the `available_sizes' field */
          /* of `FT_Face', we map `available_sizes' indices to strike    */
          /* indices                                                     */
          if ( FT_NEW_ARRAY( root->available_sizes, count ) ||
               FT_QNEW_ARRAY( sbit_strike_map, count ) )
            goto Exit;

          bsize_idx = 0;
          for ( strike_idx = 0; strike_idx < count; strike_idx++ )
          {
            FT_Bitmap_Size*  bsize = root->available_sizes + bsize_idx;


            error = sfnt->load_strike_metrics( face, strike_idx, &metrics );
            if ( error )
              continue;

            bsize->height = (FT_Short)( metrics.height >> 6 );
            bsize->width  = (FT_Short)(
              ( avgwidth * metrics.x_ppem + em_size / 2 ) / em_size );

            bsize->x_ppem = metrics.x_ppem << 6;
            bsize->y_ppem = metrics.y_ppem << 6;

            /* assume 72dpi */
            bsize->size   = metrics.y_ppem << 6;

            /* only use strikes with valid PPEM values */
            if ( bsize->x_ppem && bsize->y_ppem )
              sbit_strike_map[bsize_idx++] = strike_idx;
          }

          /* reduce array size to the actually used elements */
          FT_MEM_QRENEW_ARRAY( sbit_strike_map, count, bsize_idx );

          /* from now on, all strike indices are mapped */
          /* using `sbit_strike_map'                    */
          if ( bsize_idx )
          {
            face->sbit_strike_map = sbit_strike_map;

            root->face_flags     |= FT_FACE_FLAG_FIXED_SIZES;
            root->num_fixed_sizes = (FT_Int)bsize_idx;
          }
        }
      }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

      /* a font with no bitmaps and no outlines is scalable; */
      /* it has only empty glyphs then                       */
      if ( !FT_HAS_FIXED_SIZES( root ) && !FT_IS_SCALABLE( root ) )
        root->face_flags |= FT_FACE_FLAG_SCALABLE;


      /**********************************************************************
       *
       * Set up metrics.
       */
      if ( FT_IS_SCALABLE( root ) ||
           FT_HAS_SBIX( root )    )
      {
        /* XXX What about if outline header is missing */
        /*     (e.g. sfnt wrapped bitmap)?             */
        root->bbox.xMin    = face->header.xMin;
        root->bbox.yMin    = face->header.yMin;
        root->bbox.xMax    = face->header.xMax;
        root->bbox.yMax    = face->header.yMax;
        root->units_per_EM = face->header.Units_Per_EM;


        /*
         * Computing the ascender/descender/height is tricky.
         *
         * The OpenType specification v1.8.3 says:
         *
         *   [OS/2's] sTypoAscender, sTypoDescender and sTypoLineGap fields
         *   are intended to allow applications to lay out documents in a
         *   typographically-correct and portable fashion.
         *
         * This is somewhat at odds with the decades of backwards
         * compatibility, operating systems and applications doing whatever
         * they want, not to mention broken fonts.
         *
         * Not all fonts have an OS/2 table; in this case, we take the values
         * in the horizontal header, although there is nothing stopping the
         * values from being unreliable. Even with a OS/2 table, certain fonts
         * set the sTypoAscender, sTypoDescender and sTypoLineGap fields to 0
         * and instead correctly set usWinAscent and usWinDescent.
         *
         * As an example, Arial Narrow is shipped as four files ARIALN.TTF,
         * ARIALNI.TTF, ARIALNB.TTF and ARIALNBI.TTF. Strangely, all fonts have
         * the same values in their sTypo* fields, except ARIALNB.ttf which
         * sets them to 0. All of them have different usWinAscent/Descent
         * values. The OS/2 table therefore cannot be trusted for computing the
         * text height reliably.
         *
         * As a compromise, do the following:
         *
         * 1. If the OS/2 table exists and the fsSelection bit 7 is set
         *    (USE_TYPO_METRICS), trust the font and use the sTypo* metrics.
         * 2. Otherwise, use the `hhea' table's metrics.
         * 3. If they are zero and the OS/2 table exists,
         *    1. use the OS/2 table's sTypo* metrics if they are non-zero.
         *    2. Otherwise, use the OS/2 table's usWin* metrics.
         */

        if ( face->os2.version != 0xFFFFU && face->os2.fsSelection & 128 )
        {
          root->ascender  = face->os2.sTypoAscender;
          root->descender = face->os2.sTypoDescender;
          root->height    = root->ascender - root->descender +
                            face->os2.sTypoLineGap;
        }
        else
        {
          root->ascender  = face->horizontal.Ascender;
          root->descender = face->horizontal.Descender;
          root->height    = root->ascender - root->descender +
                            face->horizontal.Line_Gap;

          if ( !( root->ascender || root->descender ) )
          {
            if ( face->os2.version != 0xFFFFU )
            {
              if ( face->os2.sTypoAscender || face->os2.sTypoDescender )
              {
                root->ascender  = face->os2.sTypoAscender;
                root->descender = face->os2.sTypoDescender;
                root->height    = root->ascender - root->descender +
                                  face->os2.sTypoLineGap;
              }
              else
              {
                root->ascender  =  (FT_Short)face->os2.usWinAscent;
                root->descender = -(FT_Short)face->os2.usWinDescent;
                root->height    =  root->ascender - root->descender;
              }
            }
          }
        }

        root->max_advance_width  =
          (FT_Short)face->horizontal.advance_Width_Max;
        root->max_advance_height =
          (FT_Short)( face->vertical_info ? face->vertical.advance_Height_Max
                                          : root->height );

        /* See https://www.microsoft.com/typography/otspec/post.htm -- */
        /* Adjust underline position from top edge to centre of        */
        /* stroke to convert TrueType meaning to FreeType meaning.     */
        root->underline_position  = face->postscript.underlinePosition -
                                    face->postscript.underlineThickness / 2;
        root->underline_thickness = face->postscript.underlineThickness;
      }

    }

  Exit:
    FT_TRACE2(( "sfnt_load_face: done\n" ));

    return error;
  }